

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestAny::_InternalSerialize
          (TestAny *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int32_t value;
  int iVar1;
  Any *value_00;
  ulong uVar2;
  uint uVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>_> *value_01;
  uint8_t *puVar4;
  int index;
  char *in_R9;
  string *_s;
  undefined8 *puVar5;
  string_view s;
  string_view field_name;
  
  uVar3 = *(uint *)&this->field_0;
  if (((uVar3 & 4) != 0) && (value = (this->field_0)._impl_.int32_value_, value != 0)) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,value,target);
    uVar3 = *(uint *)&this->field_0;
  }
  if ((uVar3 & 2) != 0) {
    value_00 = (this->field_0)._impl_.any_value_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    index = 0;
    do {
      value_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                           (&(this->field_0)._impl_.repeated_any_value_.super_RepeatedPtrFieldBase,
                            index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (3,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  if ((uVar3 & 1) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.text_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar5[1] != (char *)0x0) {
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"proto2_unittest.TestAny.text";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar5,(char *)puVar5[1],1,0x1c,field_name);
      s._M_str = (char *)*puVar5;
      s._M_len = puVar5[1];
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,s,target)
      ;
    }
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAny::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAny& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestAny)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // int32 int32_value = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (this_._internal_int32_value() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_int32_value(), target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .google.protobuf.Any any_value = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.any_value_, this_._impl_.any_value_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.Any repeated_any_value = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_any_value_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_any_value().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // string text = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (!this_._internal_text().empty()) {
      const ::std::string& _s = this_._internal_text();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestAny.text");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestAny)
  return target;
}